

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::MergeFrom
          (SliceDynamicLayerParams *this,SliceDynamicLayerParams *from)

{
  LogMessage *other;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  SliceDynamicLayerParams *local_18;
  SliceDynamicLayerParams *from_local;
  SliceDynamicLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xd5cd);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<bool>::MergeFrom(&this->beginmasks_,&local_18->beginmasks_);
  google::protobuf::RepeatedField<long>::MergeFrom(&this->endids_,&local_18->endids_);
  google::protobuf::RepeatedField<bool>::MergeFrom(&this->endmasks_,&local_18->endmasks_);
  google::protobuf::RepeatedField<long>::MergeFrom(&this->strides_,&local_18->strides_);
  google::protobuf::RepeatedField<bool>::MergeFrom(&this->squeezemasks_,&local_18->squeezemasks_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SliceDynamicLayerParams::MergeFrom(const SliceDynamicLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SliceDynamicLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  beginmasks_.MergeFrom(from.beginmasks_);
  endids_.MergeFrom(from.endids_);
  endmasks_.MergeFrom(from.endmasks_);
  strides_.MergeFrom(from.strides_);
  squeezemasks_.MergeFrom(from.squeezemasks_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}